

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O1

IpEndpointName __thiscall
UdpSocket::Implementation::LocalEndpointFor(Implementation *this,IpEndpointName *remoteEndpoint)

{
  int iVar1;
  runtime_error *this_00;
  int *piVar2;
  uint uVar3;
  ushort uVar4;
  IpEndpointName IVar5;
  socklen_t length;
  sockaddr_in sockAddr;
  sockaddr_in connectSockAddr;
  socklen_t local_4c;
  sockaddr local_48;
  sockaddr local_38;
  sockaddr local_28;
  
  if (this->isBound_ == false) {
    __assert_fail("isBound_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TheTechnobear[P]OscProxy/oscpack/ip/posix/UdpSocket.cpp"
                  ,0x94,
                  "IpEndpointName UdpSocket::Implementation::LocalEndpointFor(const IpEndpointName &) const"
                 );
  }
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  uVar3 = (uint)remoteEndpoint->address;
  local_28.sa_data._2_4_ =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  if (remoteEndpoint->address == 0xffffffff) {
    local_28.sa_data._2_4_ = 0;
  }
  uVar4 = (ushort)remoteEndpoint->port;
  local_28.sa_data._0_2_ = uVar4 << 8 | uVar4 >> 8;
  if (remoteEndpoint->port == -1) {
    local_28.sa_data._0_2_ = 0;
  }
  local_28.sa_family = 2;
  iVar1 = connect(this->socket_,&local_28,0x10);
  if (iVar1 < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unable to connect udp socket\n");
  }
  else {
    local_48.sa_family = 0;
    local_48.sa_data[0] = '\0';
    local_48.sa_data[1] = '\0';
    local_48.sa_data[2] = '\0';
    local_48.sa_data[3] = '\0';
    local_48.sa_data[4] = '\0';
    local_48.sa_data[5] = '\0';
    local_48.sa_data[6] = '\0';
    local_48.sa_data[7] = '\0';
    local_48.sa_data[8] = '\0';
    local_48.sa_data[9] = '\0';
    local_48.sa_data[10] = '\0';
    local_48.sa_data[0xb] = '\0';
    local_48.sa_data[0xc] = '\0';
    local_48.sa_data[0xd] = '\0';
    local_4c = 0x10;
    iVar1 = getsockname(this->socket_,&local_48,&local_4c);
    if (-1 < iVar1) {
      if (this->isConnected_ == true) {
        iVar1 = connect(this->socket_,(sockaddr *)&this->connectedAddr_,0x10);
        if (iVar1 < 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"unable to connect udp socket\n");
          goto LAB_00104655;
        }
      }
      else {
        local_38.sa_family = 0;
        local_38.sa_data[0] = '\0';
        local_38.sa_data[1] = '\0';
        local_38.sa_data[2] = '\0';
        local_38.sa_data[3] = '\0';
        local_38.sa_data[4] = '\0';
        local_38.sa_data[5] = '\0';
        local_38.sa_data[6] = '\0';
        local_38.sa_data[7] = '\0';
        local_38.sa_data[8] = '\0';
        local_38.sa_data[9] = '\0';
        local_38.sa_data[10] = '\0';
        local_38.sa_data[0xb] = '\0';
        local_38.sa_data[0xc] = '\0';
        local_38.sa_data[0xd] = '\0';
        iVar1 = connect(this->socket_,&local_38,0x10);
        if (iVar1 < 0) {
          piVar2 = __errno_location();
          if (*piVar2 != 0x61) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"unable to un-connect udp socket\n");
            goto LAB_00104655;
          }
        }
      }
      IVar5.address =
           (ulong)(-(uint)(local_48.sa_data._2_4_ == 0) |
                  (uint)local_48.sa_data._2_4_ >> 0x18 | (local_48.sa_data._2_4_ & 0xff0000) >> 8 |
                  (local_48.sa_data._2_4_ & 0xff00) << 8 | local_48.sa_data._2_4_ << 0x18);
      IVar5.port = -(uint)(local_48.sa_data._0_2_ == 0) |
                   (uint)(ushort)(local_48.sa_data._0_2_ << 8 | (ushort)local_48.sa_data._0_2_ >> 8)
      ;
      IVar5._12_4_ = 0;
      return IVar5;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unable to getsockname\n");
  }
LAB_00104655:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

IpEndpointName LocalEndpointFor( const IpEndpointName& remoteEndpoint ) const
	{
		assert( isBound_ );

		// first connect the socket to the remote server
        
        struct sockaddr_in connectSockAddr;
		SockaddrFromIpEndpointName( connectSockAddr, remoteEndpoint );
       
        if (connect(socket_, (struct sockaddr *)&connectSockAddr, sizeof(connectSockAddr)) < 0) {
            throw std::runtime_error("unable to connect udp socket\n");
        }

        // get the address

        struct sockaddr_in sockAddr;
        std::memset( (char *)&sockAddr, 0, sizeof(sockAddr ) );
        socklen_t length = sizeof(sockAddr);
        if (getsockname(socket_, (struct sockaddr *)&sockAddr, &length) < 0) {
            throw std::runtime_error("unable to getsockname\n");
        }
        
		if( isConnected_ ){
			// reconnect to the connected address
			
			if (connect(socket_, (struct sockaddr *)&connectedAddr_, sizeof(connectedAddr_)) < 0) {
				throw std::runtime_error("unable to connect udp socket\n");
			}

		}else{
			// unconnect from the remote address
		
			struct sockaddr_in unconnectSockAddr;
			std::memset( (char *)&unconnectSockAddr, 0, sizeof(unconnectSockAddr ) );
			unconnectSockAddr.sin_family = AF_UNSPEC;
			// address fields are zero
			int connectResult = connect(socket_, (struct sockaddr *)&unconnectSockAddr, sizeof(unconnectSockAddr));
			if ( connectResult < 0 && errno != EAFNOSUPPORT ) {
				throw std::runtime_error("unable to un-connect udp socket\n");
			}
		}

		return IpEndpointNameFromSockaddr( sockAddr );
	}